

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void JS_AddIntrinsicBaseObjects(JSContext *ctx)

{
  JSValue *pJVar1;
  JSValue *pJVar2;
  JSValueUnion JVar3;
  size_t sVar4;
  JSCFunctionListEntry *__s;
  char *pcVar5;
  uint argc;
  JSRefCountHeader *p;
  JSCFunctionListEntry *prop;
  int64_t extraout_RDX;
  JSAtom atom;
  long lVar6;
  JSValueUnion *pJVar7;
  JSValueUnion *pJVar8;
  int iVar9;
  JSValueUnion *prop_00;
  byte bVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue proto;
  JSValue val;
  char unscopables [74];
  JSValueUnion local_a0;
  int64_t iStack_98;
  JSValueUnion local_88;
  long local_80;
  undefined2 local_40;
  
  bVar10 = 0;
  JVar11 = JS_NewCFunction3(ctx,js_throw_type_error,(char *)0x0,0,JS_CFUNC_generic,0,
                            ctx->function_proto);
  ctx->throw_type_error = JVar11;
  JVar11 = JS_NewCFunction3(ctx,js_function_proto_caller,(char *)0x0,0,JS_CFUNC_generic,0,
                            ctx->function_proto);
  local_a0 = JVar11.u;
  iStack_98 = JVar11.tag;
  JS_DefineProperty(ctx,ctx->function_proto,0x4f,(JSValue)(ZEXT816(3) << 0x40),JVar11,
                    ctx->throw_type_error,0x1901);
  JVar3 = (JSValueUnion)(ctx->function_proto).u.ptr;
  argc = 0x4d;
  JS_DefineProperty(ctx,ctx->function_proto,0x4d,(JSValue)(ZEXT816(3) << 0x40),JVar11,
                    ctx->throw_type_error,0x1901);
  local_88.float64 = local_a0.float64;
  if (0xfffffff4 < (uint)JVar11.tag) {
    argc = *local_a0.ptr;
    JVar3._0_4_ = argc - 1;
    JVar3._4_4_ = 0;
    *(uint *)local_a0.ptr = JVar3._0_4_;
    if ((int)argc < 2) {
      __JS_FreeValueRT(ctx->rt,JVar11);
      iStack_98 = extraout_RDX;
      JVar3 = local_a0;
    }
  }
  pJVar1 = &ctx->function_proto;
  JVar11.tag = iStack_98;
  JVar11.u.float64 = JVar3.float64;
  JVar11 = js_object_seal(ctx,JVar11,argc,&ctx->throw_type_error,1);
  local_88 = JVar11.u;
  if ((0xfffffff4 < (uint)JVar11.tag) &&
     (iVar9 = *local_88.ptr, *(int *)local_88.ptr = iVar9 + -1, iVar9 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar11);
  }
  JVar11 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
  ctx->global_obj = JVar11;
  iVar9 = 0;
  JVar11 = JS_NewObjectProtoClass(ctx,(JSValue)(ZEXT816(2) << 0x40),1);
  ctx->global_var_obj = JVar11;
  JVar11 = ctx->class_proto[1];
  JVar12 = JS_NewCFunction3(ctx,js_object_constructor,"Object",1,JS_CFUNC_constructor_or_func,0,
                            *pJVar1);
  JS_NewGlobalCConstructor2(ctx,JVar12,"Object",JVar11);
  JS_SetPropertyFunctionList(ctx,JVar12,js_object_funcs,0x16);
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[1],js_object_proto_funcs,0xb);
  JS_SetPropertyFunctionList(ctx,ctx->function_proto,js_function_proto_funcs,7);
  JVar11 = JS_NewCFunction3(ctx,js_function_constructor,"Function",1,
                            JS_CFUNC_constructor_or_func_magic,0,*pJVar1);
  local_88 = JVar11.u;
  ctx->function_ctor = JVar11;
  if (0xfffffff4 < (uint)JVar11.tag) {
    *(int *)local_88.ptr = *local_88.ptr + 1;
  }
  JS_NewGlobalCConstructor2(ctx,JVar11,"Function",ctx->function_proto);
  JVar11 = JS_NewCFunction3(ctx,js_error_constructor,"Error",1,JS_CFUNC_constructor_or_func_magic,-1
                            ,*pJVar1);
  JS_NewGlobalCConstructor2(ctx,JVar11,"Error",ctx->class_proto[3]);
  lVar6 = 0;
  do {
    pcVar5 = *(char **)((long)native_error_name + lVar6);
    JVar12 = JS_NewCFunction3(ctx,js_error_constructor,pcVar5,(lVar6 == 0x38) + 1,
                              JS_CFUNC_constructor_or_func_magic,iVar9,JVar11);
    proto.tag = *(int64_t *)((long)&ctx->native_error_proto[0].tag + lVar6 * 2);
    proto.u.ptr = ((JSValueUnion *)((long)&ctx->native_error_proto[0].u + lVar6 * 2))->ptr;
    JS_NewGlobalCConstructor2(ctx,JVar12,pcVar5,proto);
    iVar9 = iVar9 + 1;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x40);
  JVar11 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
  ctx->iterator_proto = JVar11;
  JS_SetPropertyFunctionList(ctx,JVar11,js_iterator_proto_funcs,1);
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[2],js_array_proto_funcs,0x20);
  JVar11 = ctx->class_proto[2];
  JVar12 = JS_NewCFunction3(ctx,js_array_constructor,"Array",1,JS_CFUNC_constructor_or_func,0,
                            *pJVar1);
  JVar3 = JVar12.u;
  JS_NewGlobalCConstructor2(ctx,JVar12,"Array",JVar11);
  if (0xfffffff4 < (uint)JVar12.tag) {
    *(int *)JVar3.ptr = *JVar3.ptr + 1;
  }
  ctx->array_ctor = JVar12;
  local_88 = JVar3;
  JS_SetPropertyFunctionList(ctx,JVar12,js_array_funcs,4);
  prop_00 = &local_88;
  pJVar7 = (JSValueUnion *)"copyWithin";
  pJVar8 = prop_00;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pJVar8 = *pJVar7;
    pJVar7 = pJVar7 + (ulong)bVar10 * -2 + 1;
    pJVar8 = pJVar8 + (ulong)bVar10 * -2 + 1;
  }
  local_40 = 0;
  JVar11 = JS_NewObjectProtoClass(ctx,(JSValue)(ZEXT816(2) << 0x40),1);
  for (; *(char *)prop_00 != '\0'; prop_00 = (JSValueUnion *)((long)prop_00 + sVar4 + 1)) {
    val.tag = 1;
    val.u.float64 = 4.94065645841247e-324;
    JS_DefinePropertyValueStr(ctx,JVar11,(char *)&prop_00->int32,val,7);
    sVar4 = strlen((char *)&prop_00->int32);
  }
  JS_DefinePropertyValue(ctx,ctx->class_proto[2],0xd0,JVar11,1);
  JVar11 = JS_GetPropertyInternal(ctx,ctx->class_proto[2],0x6b,ctx->class_proto[2],0);
  ctx->array_proto_values = JVar11;
  pJVar2 = ctx->class_proto;
  JVar11 = JS_NewObjectProtoClass(ctx,ctx->iterator_proto,1);
  pJVar2[0x25] = JVar11;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x25],js_array_iterator_proto_funcs,2);
  JS_SetPropertyFunctionList(ctx,ctx->global_obj,js_global_funcs,0xe);
  pJVar2 = ctx->class_proto;
  JVar11 = JS_NewObjectProtoClass(ctx,pJVar2[1],4);
  pJVar2[4] = JVar11;
  JS_SetObjectData(ctx,ctx->class_proto[4],(JSValue)ZEXT816(0));
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[4],js_number_proto_funcs,6);
  JVar11 = ctx->class_proto[4];
  JVar12 = JS_NewCFunction3(ctx,js_number_constructor,"Number",1,JS_CFUNC_constructor_or_func,0,
                            *pJVar1);
  JS_NewGlobalCConstructor2(ctx,JVar12,"Number",JVar11);
  JS_SetPropertyFunctionList(ctx,JVar12,js_number_funcs,0xe);
  pJVar2 = ctx->class_proto;
  JVar11 = JS_NewObjectProtoClass(ctx,pJVar2[1],6);
  pJVar2[6] = JVar11;
  JS_SetObjectData(ctx,ctx->class_proto[6],(JSValue)(ZEXT816(1) << 0x40));
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[6],js_boolean_proto_funcs,2);
  JVar11 = ctx->class_proto[6];
  JVar12 = JS_NewCFunction3(ctx,js_boolean_constructor,"Boolean",1,JS_CFUNC_constructor_or_func,0,
                            *pJVar1);
  JS_NewGlobalCConstructor2(ctx,JVar12,"Boolean",JVar11);
  pJVar2 = ctx->class_proto;
  JVar11 = JS_NewObjectProtoClass(ctx,pJVar2[1],5);
  pJVar2[5] = JVar11;
  pJVar2 = ctx->class_proto;
  JVar3 = (JSValueUnion)((JSValueUnion *)(ctx->rt->atom_array + 0x2f))->ptr;
  *(int *)JVar3.ptr = *JVar3.ptr + 1;
  JVar12.tag = -7;
  JVar12.u.ptr = JVar3.ptr;
  JS_SetObjectData(ctx,pJVar2[5],JVar12);
  JVar11 = ctx->class_proto[5];
  JVar12 = JS_NewCFunction3(ctx,js_string_constructor,"String",1,JS_CFUNC_constructor_or_func,0,
                            *pJVar1);
  JS_NewGlobalCConstructor2(ctx,JVar12,"String",JVar11);
  JS_SetPropertyFunctionList(ctx,JVar12,js_string_funcs,3);
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[5],js_string_proto_funcs,0x31);
  pJVar2 = ctx->class_proto;
  JVar11 = JS_NewObjectProtoClass(ctx,ctx->iterator_proto,1);
  pJVar2[0x26] = JVar11;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x26],js_string_iterator_proto_funcs,2);
  gettimeofday((timeval *)&local_88,(__timezone_ptr_t)0x0);
  ctx->random_state =
       (long)local_88.ptr * 1000000 + local_80 +
       (ulong)((long)local_88.ptr * 1000000 + local_80 == 0);
  JS_SetPropertyFunctionList(ctx,ctx->global_obj,js_math_obj,1);
  JS_SetPropertyFunctionList(ctx,ctx->global_obj,js_reflect_obj,1);
  pJVar2 = ctx->class_proto;
  JVar11 = JS_NewObjectProtoClass(ctx,pJVar2[1],1);
  pJVar2[7] = JVar11;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[7],js_symbol_proto_funcs,5);
  JVar11 = ctx->class_proto[7];
  JVar12 = JS_NewCFunction3(ctx,js_symbol_constructor,"Symbol",0,JS_CFUNC_constructor_or_func,0,
                            *pJVar1);
  JS_NewGlobalCConstructor2(ctx,JVar12,"Symbol",JVar11);
  prop = js_symbol_funcs;
  JS_SetPropertyFunctionList(ctx,JVar12,js_symbol_funcs,2);
  atom = 0xc5;
  do {
    __s = (JSCFunctionListEntry *)JS_AtomGetStrRT(ctx->rt,(char *)&local_88.int32,atom,(JSAtom)prop)
    ;
    pcVar5 = strchr((char *)__s,0x2e);
    prop = (JSCFunctionListEntry *)(pcVar5 + 1);
    if (pcVar5 == (char *)0x0) {
      prop = __s;
    }
    JVar11 = __JS_AtomToValue(ctx,atom,0);
    JS_DefinePropertyValueStr(ctx,JVar12,(char *)prop,JVar11,0);
    atom = atom + 1;
  } while (atom != 0xd2);
  pJVar2 = ctx->class_proto;
  JVar11 = JS_NewObjectProtoClass(ctx,ctx->iterator_proto,1);
  pJVar2[0x28] = JVar11;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x28],js_generator_proto_funcs,4);
  pJVar2 = ctx->class_proto;
  JVar11 = JS_NewObjectProtoClass(ctx,ctx->function_proto,1);
  pJVar2[0x10] = JVar11;
  JVar11 = JS_NewCFunction3(ctx,js_function_constructor,"GeneratorFunction",1,
                            JS_CFUNC_constructor_or_func_magic,1,*pJVar1);
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x10],js_generator_function_proto_funcs,1);
  JS_SetConstructor2(ctx,ctx->class_proto[0x10],ctx->class_proto[0x28],1,1);
  JS_SetConstructor2(ctx,JVar11,ctx->class_proto[0x10],0,1);
  local_a0 = JVar11.u;
  local_88.float64 = local_a0.float64;
  if ((0xfffffff4 < (uint)JVar11.tag) &&
     (iVar9 = *local_a0.ptr, *(int *)local_a0.ptr = iVar9 + -1, iVar9 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar11);
  }
  JVar11 = JS_NewCFunction3(ctx,js_global_eval,"eval",1,JS_CFUNC_generic,0,*pJVar1);
  local_88 = JVar11.u;
  ctx->eval_obj = JVar11;
  if (0xfffffff4 < (uint)JVar11.tag) {
    *(int *)local_88.ptr = *local_88.ptr + 1;
  }
  JS_DefinePropertyValue(ctx,ctx->global_obj,0x3a,JVar11,3);
  local_88 = (JSValueUnion)(ctx->global_obj).u.ptr;
  JVar11 = ctx->global_obj;
  if (0xfffffff4 < (uint)(ctx->global_obj).tag) {
    *(int *)local_88.ptr = *local_88.ptr + 1;
  }
  JS_DefinePropertyValue(ctx,ctx->global_obj,0x8a,JVar11,3);
  return;
}

Assistant:

void JS_AddIntrinsicBaseObjects(JSContext *ctx)
{
    int i;
    JSValueConst obj, number_obj;
    JSValue obj1;

    ctx->throw_type_error = JS_NewCFunction(ctx, js_throw_type_error, NULL, 0);

    /* add caller and arguments properties to throw a TypeError */
    obj1 = JS_NewCFunction(ctx, js_function_proto_caller, NULL, 0);
    JS_DefineProperty(ctx, ctx->function_proto, JS_ATOM_caller, JS_UNDEFINED,
                      obj1, ctx->throw_type_error,
                      JS_PROP_HAS_GET | JS_PROP_HAS_SET |
                      JS_PROP_HAS_CONFIGURABLE | JS_PROP_CONFIGURABLE);
    JS_DefineProperty(ctx, ctx->function_proto, JS_ATOM_arguments, JS_UNDEFINED,
                      obj1, ctx->throw_type_error,
                      JS_PROP_HAS_GET | JS_PROP_HAS_SET |
                      JS_PROP_HAS_CONFIGURABLE | JS_PROP_CONFIGURABLE);
    JS_FreeValue(ctx, obj1);
    JS_FreeValue(ctx, js_object_seal(ctx, JS_UNDEFINED, 1, (JSValueConst *)&ctx->throw_type_error, 1));

    ctx->global_obj = JS_NewObject(ctx);
    ctx->global_var_obj = JS_NewObjectProto(ctx, JS_NULL);

    /* Object */
    obj = JS_NewGlobalCConstructor(ctx, "Object", js_object_constructor, 1,
                                   ctx->class_proto[JS_CLASS_OBJECT]);
    JS_SetPropertyFunctionList(ctx, obj, js_object_funcs, countof(js_object_funcs));
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_OBJECT],
                               js_object_proto_funcs, countof(js_object_proto_funcs));

    /* Function */
    JS_SetPropertyFunctionList(ctx, ctx->function_proto, js_function_proto_funcs, countof(js_function_proto_funcs));
    ctx->function_ctor = JS_NewCFunctionMagic(ctx, js_function_constructor,
                                              "Function", 1, JS_CFUNC_constructor_or_func_magic,
                                              JS_FUNC_NORMAL);
    JS_NewGlobalCConstructor2(ctx, JS_DupValue(ctx, ctx->function_ctor), "Function",
                              ctx->function_proto);

    /* Error */
    obj1 = JS_NewCFunctionMagic(ctx, js_error_constructor,
                                "Error", 1, JS_CFUNC_constructor_or_func_magic, -1);
    JS_NewGlobalCConstructor2(ctx, obj1,
                              "Error", ctx->class_proto[JS_CLASS_ERROR]);

    for(i = 0; i < JS_NATIVE_ERROR_COUNT; i++) {
        JSValue func_obj;
        int n_args;
        n_args = 1 + (i == JS_AGGREGATE_ERROR);
        func_obj = JS_NewCFunction3(ctx, (JSCFunction *)js_error_constructor,
                                    native_error_name[i], n_args,
                                    JS_CFUNC_constructor_or_func_magic, i, obj1);
        JS_NewGlobalCConstructor2(ctx, func_obj, native_error_name[i],
                                  ctx->native_error_proto[i]);
    }

    /* Iterator prototype */
    ctx->iterator_proto = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->iterator_proto,
                               js_iterator_proto_funcs,
                               countof(js_iterator_proto_funcs));

    /* Array */
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_ARRAY],
                               js_array_proto_funcs,
                               countof(js_array_proto_funcs));

    obj = JS_NewGlobalCConstructor(ctx, "Array", js_array_constructor, 1,
                                   ctx->class_proto[JS_CLASS_ARRAY]);
    ctx->array_ctor = JS_DupValue(ctx, obj);
    JS_SetPropertyFunctionList(ctx, obj, js_array_funcs,
                               countof(js_array_funcs));

    /* XXX: create auto_initializer */
    {
        /* initialize Array.prototype[Symbol.unscopables] */
        char const unscopables[] = "copyWithin" "\0" "entries" "\0" "fill" "\0" "find" "\0"
            "findIndex" "\0" "flat" "\0" "flatMap" "\0" "includes" "\0" "keys" "\0" "values" "\0";
        const char *p = unscopables;
        obj1 = JS_NewObjectProto(ctx, JS_NULL);
        for(p = unscopables; *p; p += strlen(p) + 1) {
            JS_DefinePropertyValueStr(ctx, obj1, p, JS_TRUE, JS_PROP_C_W_E);
        }
        JS_DefinePropertyValue(ctx, ctx->class_proto[JS_CLASS_ARRAY],
                               JS_ATOM_Symbol_unscopables, obj1,
                               JS_PROP_CONFIGURABLE);
    }

    /* needed to initialize arguments[Symbol.iterator] */
    ctx->array_proto_values =
        JS_GetProperty(ctx, ctx->class_proto[JS_CLASS_ARRAY], JS_ATOM_values);

    ctx->class_proto[JS_CLASS_ARRAY_ITERATOR] = JS_NewObjectProto(ctx, ctx->iterator_proto);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_ARRAY_ITERATOR],
                               js_array_iterator_proto_funcs,
                               countof(js_array_iterator_proto_funcs));

    /* parseFloat and parseInteger must be defined before Number
       because of the Number.parseFloat and Number.parseInteger
       aliases */
    JS_SetPropertyFunctionList(ctx, ctx->global_obj, js_global_funcs,
                               countof(js_global_funcs));

    /* Number */
    ctx->class_proto[JS_CLASS_NUMBER] = JS_NewObjectProtoClass(ctx, ctx->class_proto[JS_CLASS_OBJECT],
                                                               JS_CLASS_NUMBER);
    JS_SetObjectData(ctx, ctx->class_proto[JS_CLASS_NUMBER], JS_NewInt32(ctx, 0));
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_NUMBER],
                               js_number_proto_funcs,
                               countof(js_number_proto_funcs));
    number_obj = JS_NewGlobalCConstructor(ctx, "Number", js_number_constructor, 1,
                                          ctx->class_proto[JS_CLASS_NUMBER]);
    JS_SetPropertyFunctionList(ctx, number_obj, js_number_funcs, countof(js_number_funcs));

    /* Boolean */
    ctx->class_proto[JS_CLASS_BOOLEAN] = JS_NewObjectProtoClass(ctx, ctx->class_proto[JS_CLASS_OBJECT],
                                                                JS_CLASS_BOOLEAN);
    JS_SetObjectData(ctx, ctx->class_proto[JS_CLASS_BOOLEAN], JS_NewBool(ctx, FALSE));
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_BOOLEAN], js_boolean_proto_funcs,
                               countof(js_boolean_proto_funcs));
    JS_NewGlobalCConstructor(ctx, "Boolean", js_boolean_constructor, 1,
                             ctx->class_proto[JS_CLASS_BOOLEAN]);

    /* String */
    ctx->class_proto[JS_CLASS_STRING] = JS_NewObjectProtoClass(ctx, ctx->class_proto[JS_CLASS_OBJECT],
                                                               JS_CLASS_STRING);
    JS_SetObjectData(ctx, ctx->class_proto[JS_CLASS_STRING], JS_AtomToString(ctx, JS_ATOM_empty_string));
    obj = JS_NewGlobalCConstructor(ctx, "String", js_string_constructor, 1,
                                   ctx->class_proto[JS_CLASS_STRING]);
    JS_SetPropertyFunctionList(ctx, obj, js_string_funcs,
                               countof(js_string_funcs));
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_STRING], js_string_proto_funcs,
                               countof(js_string_proto_funcs));

    ctx->class_proto[JS_CLASS_STRING_ITERATOR] = JS_NewObjectProto(ctx, ctx->iterator_proto);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_STRING_ITERATOR],
                               js_string_iterator_proto_funcs,
                               countof(js_string_iterator_proto_funcs));

    /* Math: create as autoinit object */
    js_random_init(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->global_obj, js_math_obj, countof(js_math_obj));

    /* ES6 Reflect: create as autoinit object */
    JS_SetPropertyFunctionList(ctx, ctx->global_obj, js_reflect_obj, countof(js_reflect_obj));

    /* ES6 Symbol */
    ctx->class_proto[JS_CLASS_SYMBOL] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_SYMBOL], js_symbol_proto_funcs,
                               countof(js_symbol_proto_funcs));
    obj = JS_NewGlobalCConstructor(ctx, "Symbol", js_symbol_constructor, 0,
                                   ctx->class_proto[JS_CLASS_SYMBOL]);
    JS_SetPropertyFunctionList(ctx, obj, js_symbol_funcs,
                               countof(js_symbol_funcs));
    for(i = JS_ATOM_Symbol_toPrimitive; i < JS_ATOM_END; i++) {
        char buf[ATOM_GET_STR_BUF_SIZE];
        const char *str, *p;
        str = JS_AtomGetStr(ctx, buf, sizeof(buf), i);
        /* skip "Symbol." */
        p = strchr(str, '.');
        if (p)
            str = p + 1;
        JS_DefinePropertyValueStr(ctx, obj, str, JS_AtomToValue(ctx, i), 0);
    }

    /* ES6 Generator */
    ctx->class_proto[JS_CLASS_GENERATOR] = JS_NewObjectProto(ctx, ctx->iterator_proto);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_GENERATOR],
                               js_generator_proto_funcs,
                               countof(js_generator_proto_funcs));

    ctx->class_proto[JS_CLASS_GENERATOR_FUNCTION] = JS_NewObjectProto(ctx, ctx->function_proto);
    obj1 = JS_NewCFunctionMagic(ctx, js_function_constructor,
                                "GeneratorFunction", 1,
                                JS_CFUNC_constructor_or_func_magic, JS_FUNC_GENERATOR);
    JS_SetPropertyFunctionList(ctx,
                               ctx->class_proto[JS_CLASS_GENERATOR_FUNCTION],
                               js_generator_function_proto_funcs,
                               countof(js_generator_function_proto_funcs));
    JS_SetConstructor2(ctx, ctx->class_proto[JS_CLASS_GENERATOR_FUNCTION],
                       ctx->class_proto[JS_CLASS_GENERATOR],
                       JS_PROP_CONFIGURABLE, JS_PROP_CONFIGURABLE);
    JS_SetConstructor2(ctx, obj1, ctx->class_proto[JS_CLASS_GENERATOR_FUNCTION],
                       0, JS_PROP_CONFIGURABLE);
    JS_FreeValue(ctx, obj1);

    /* global properties */
    ctx->eval_obj = JS_NewCFunction(ctx, js_global_eval, "eval", 1);
    JS_DefinePropertyValue(ctx, ctx->global_obj, JS_ATOM_eval,
                           JS_DupValue(ctx, ctx->eval_obj),
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);

    JS_DefinePropertyValue(ctx, ctx->global_obj, JS_ATOM_globalThis,
                           JS_DupValue(ctx, ctx->global_obj),
                           JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE);
}